

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAT.cpp
# Opt level: O1

optional<Storage::Disk::FAT::Volume> *
Storage::Disk::FAT::GetVolume
          (optional<Storage::Disk::FAT::Volume> *__return_storage_ptr__,
          shared_ptr<Storage::Disk::Disk> *disk)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  undefined2 uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  pointer pvVar10;
  pointer puVar11;
  uchar *puVar12;
  uchar *puVar13;
  ushort uVar14;
  void *pvVar15;
  undefined3 uVar16;
  int iVar17;
  Sector *pSVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  unsigned_short uVar23;
  long lVar24;
  bool bVar25;
  Volume volume;
  vector<unsigned_char,_std::allocator<unsigned_char>_> source_fat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> root_directory;
  Parser parser;
  undefined1 uStack_135;
  undefined1 uStack_131;
  undefined1 uStack_12a;
  undefined1 uStack_129;
  undefined1 uStack_125;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vStack_120;
  vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_> vStack_108;
  int local_ec;
  void *local_e8;
  void *pvStack_e0;
  long local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_> local_a8;
  Directory local_90;
  Parser local_78;
  
  Encodings::MFM::Parser::Parser(&local_78,Double,disk);
  pSVar18 = Encodings::MFM::Parser::sector(&local_78,0,0,'\x01');
  if (((pSVar18 == (Sector *)0x0) ||
      (pvVar10 = (pSVar18->samples).
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      pvVar10 ==
      (pSVar18->samples).
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) ||
     ((ulong)((long)(pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) < 0x200)) {
    (__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>).
    _M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
    super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_engaged = false;
  }
  else {
    bVar25 = false;
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    puVar11 = (pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = *(ushort *)(puVar11 + 0xb);
    uVar16 = *(undefined3 *)(puVar11 + 0xb);
    uVar5 = *(ushort *)(puVar11 + 0xe);
    bVar1 = puVar11[0x10];
    uVar6 = *(undefined2 *)(puVar11 + 0x13);
    uVar7 = *(ushort *)(puVar11 + 0x16);
    uVar8 = *(ushort *)(puVar11 + 0x18);
    uVar9 = *(ushort *)(puVar11 + 0x1a);
    uStack_12a = (undefined1)uVar9;
    uStack_129 = (undefined1)(uVar9 >> 8);
    if (puVar11[0x1fe] == 'U') {
      bVar25 = puVar11[0x1ff] == 0xaa;
    }
    local_ec = (int)((uint)uVar4 + ((uint)puVar11[0x11] << 5 | (uint)puVar11[0x12] << 0xd) + -1) /
               (int)(uint)uVar4;
    iVar19 = (uint)uVar7 * (uint)bVar1 + (uint)uVar5 + local_ec;
    local_e8 = (void *)0x0;
    pvStack_e0 = (void *)0x0;
    local_d8 = 0;
    if (uVar7 != 0) {
      uVar20 = 0;
      do {
        uVar21 = (ulong)(uVar5 + uVar20) / (ulong)uVar8;
        pSVar18 = Encodings::MFM::Parser::sector
                            (&local_78,(int)(uVar21 % (ulong)uVar9),(int)(uVar21 / uVar9),
                             (char)((ulong)(uVar5 + uVar20) % (ulong)uVar8) + '\x01');
        if ((pSVar18 == (Sector *)0x0) ||
           (pvVar10 = (pSVar18->samples).
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           pvVar10 ==
           (pSVar18->samples).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_00448afb:
          (__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>).
          _M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
          super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_engaged = false;
          goto LAB_00448b20;
        }
        puVar12 = (pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar13 = (pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((long)puVar13 - (long)puVar12 != (ulong)uVar4) goto LAB_00448afb;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (puVar12,puVar13,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
        uVar20 = uVar20 + 1;
      } while (uVar20 < uVar7);
    }
    if (pvStack_e0 != local_e8) {
      uVar21 = 0;
      do {
        bVar2 = *(byte *)((long)local_e8 + uVar21 + 1);
        uVar14 = CONCAT11(bVar2,*(undefined1 *)((long)local_e8 + uVar21));
        bVar3 = *(byte *)((long)local_e8 + uVar21 + 2);
        local_a8.
        super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(CONCAT62(local_a8.
                                super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                                ._M_impl.super__Vector_impl_data._M_start._2_6_,uVar14) &
                      0xffffffffffff0fff);
        if (vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (unsigned_short *)
            CONCAT44(vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_)) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>
                    (&vStack_120,
                     (iterator)
                     vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)&local_a8);
        }
        else {
          *vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar14 & 0xfff;
          vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar23 = (unsigned_short)(((uint)bVar3 << 0x10 | (uint)bVar2 << 8) >> 0xc);
        local_a8.
        super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT62(local_a8.
                               super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                               ._M_impl.super__Vector_impl_data._M_start._2_6_,uVar23);
        if (vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (unsigned_short *)
            CONCAT44(vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_)) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>
                    (&vStack_120,
                     (iterator)
                     vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)&local_a8);
        }
        else {
          *vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar23;
          vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar21 = uVar21 + 3;
      } while (uVar21 < (ulong)((long)pvStack_e0 - (long)local_e8));
    }
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_ec != 0) {
      lVar22 = (long)local_ec;
      lVar24 = 0;
      do {
        iVar17 = (uint)uVar5 + (int)lVar24 + (uint)bVar1 * (uint)uVar7;
        uVar21 = (long)iVar17 / (long)(int)(uint)uVar8;
        uVar21 = (ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff;
        pSVar18 = Encodings::MFM::Parser::sector
                            (&local_78,(int)((long)uVar21 % (long)(int)(uint)uVar9),
                             (int)((long)uVar21 / (long)(int)(uint)uVar9),
                             (char)(iVar17 % (int)(uint)uVar8) + '\x01');
        if ((pSVar18 == (Sector *)0x0) ||
           (pvVar10 = (pSVar18->samples).
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           pvVar10 ==
           (pSVar18->samples).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_00448b01:
          bVar25 = false;
          goto LAB_00448b03;
        }
        puVar12 = (pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar13 = (pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((long)puVar13 - (long)puVar12 != (ulong)uVar4) goto LAB_00448b01;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (puVar12,puVar13,&local_c8);
        lVar24 = lVar24 + 1;
      } while (lVar22 != lVar24);
    }
    anon_unknown.dwarf_132be18::directory_from(&local_90,&local_c8);
    local_a8.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vStack_108.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           vStack_108.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_);
    local_a8.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(vStack_108.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           vStack_108.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    local_a8.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(vStack_108.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           vStack_108.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         SUB84(local_90.
               super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
               ._M_impl.super__Vector_impl_data._M_start,0);
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ =
         (undefined4)
         ((ulong)local_90.
                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 0x20);
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         SUB84(local_90.
               super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
               ._M_impl.super__Vector_impl_data._M_finish,0);
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         (undefined4)
         ((ulong)local_90.
                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                 ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         SUB84(local_90.
               super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)
         ((ulong)local_90.
                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
    local_90.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>::~vector
              (&local_a8);
    std::vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>::~vector
              (&local_90);
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>)._M_payload.
                      super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
                      super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload + 0x10) =
         (ulong)CONCAT42(iVar19,CONCAT11(uStack_125,bVar25)) << 0x10;
    *(ulong *)&(__return_storage_ptr__->
               super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>)._M_payload.
               super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
               super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload =
         CONCAT17(uStack_131,CONCAT16(bVar1,CONCAT24(uVar5,CONCAT13(uStack_135,uVar16))));
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>)._M_payload.
                      super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
                      super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload + 8) =
         CONCAT17(uStack_129,CONCAT16(uStack_12a,CONCAT24(uVar8,CONCAT22(uVar7,uVar6))));
    *(ulong *)&(__return_storage_ptr__->
               super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>)._M_payload.
               super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
               super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload._M_value.fat.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl =
         CONCAT44(vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                  vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start._0_4_);
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>
             )._M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
             super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload + 0x20) =
         vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>
             )._M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
             super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload._M_value.fat.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_> + 0x10) =
         (pointer)CONCAT44(vStack_120.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           vStack_120.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    vStack_120.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
    *(ulong *)&(__return_storage_ptr__->
               super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>)._M_payload.
               super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
               super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload._M_value.
               root_directory.
               super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
               ._M_impl =
         CONCAT44(vStack_108.
                  super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                  vStack_108.
                  super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>
             )._M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
             super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload._M_value.
             root_directory.
             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
     + 8) = (pointer)CONCAT44(vStack_108.
                              super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                              ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                              vStack_108.
                              super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>
             )._M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
             super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload._M_value.
             root_directory.
             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
     + 0x10) = (pointer)CONCAT44(vStack_108.
                                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 vStack_108.
                                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    vStack_108.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bVar25 = true;
LAB_00448b03:
    (__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>).
    _M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
    super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_engaged = bVar25;
    if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
LAB_00448b20:
    if (local_e8 != (void *)0x0) {
      operator_delete(local_e8,local_d8 - (long)local_e8);
    }
    std::vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>::~vector
              (&vStack_108);
    pvVar15 = (void *)CONCAT44(vStack_120.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               vStack_120.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar15 != (void *)0x0) {
      operator_delete(pvVar15,CONCAT44(vStack_120.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                       vStack_120.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                              (long)pvVar15);
    }
  }
  std::
  _Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>_>_>
  ::~_Rb_tree(&local_78.sectors_by_address_by_track_._M_t);
  if (local_78.disk_.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.disk_.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<FAT::Volume> FAT::GetVolume(const std::shared_ptr<Storage::Disk::Disk> &disk) {
	Storage::Encodings::MFM::Parser parser(Storage::Encodings::MFM::Density::Double, disk);

	// Grab the boot sector; that'll be enough to establish the volume.
	const Storage::Encodings::MFM::Sector *const boot_sector = parser.sector(0, 0, 1);
	if(!boot_sector || boot_sector->samples.empty() || boot_sector->samples[0].size() < 512) {
		return std::nullopt;
	}

	// Obtain volume details.
	const auto &data = boot_sector->samples[0];
	FAT::Volume volume;
	volume.bytes_per_sector = uint16_t(data[11] | (data[12] << 8));
	volume.sectors_per_cluster = data[13];
	volume.reserved_sectors = uint16_t(data[14] | (data[15] << 8));
	volume.fat_copies = data[16];
	const uint16_t root_directory_entries = uint16_t(data[17] | (data[18] << 8));
	volume.total_sectors = uint16_t(data[19] | (data[20] << 8));
	volume.sectors_per_fat = uint16_t(data[22] | (data[23] << 8));
	volume.sectors_per_track = uint16_t(data[24] | (data[25] << 8));
	volume.head_count = uint16_t(data[26] | (data[27] << 8));
	volume.correct_signature = data[510] == 0x55 && data[511] == 0xaa;

	const size_t root_directory_sectors = (root_directory_entries*32 + volume.bytes_per_sector - 1) / volume.bytes_per_sector;
	volume.first_data_sector = int(volume.reserved_sectors + volume.sectors_per_fat*volume.fat_copies + root_directory_sectors);

	// Grab the FAT.
	std::vector<uint8_t> source_fat;
	for(int c = 0; c < volume.sectors_per_fat; c++) {
		const int sector_number = volume.reserved_sectors + c;
		const auto address = volume.chs_for_sector(sector_number);

		const Storage::Encodings::MFM::Sector *const fat_sector =
			parser.sector(address.head, address.cylinder, uint8_t(address.sector));
		if(!fat_sector || fat_sector->samples.empty() || fat_sector->samples[0].size() != volume.bytes_per_sector) {
			return std::nullopt;
		}
		std::copy(fat_sector->samples[0].begin(), fat_sector->samples[0].end(), std::back_inserter(source_fat));
	}

	// Decode the FAT.
	// TODO: stop assuming FAT12 here.
	for(size_t c = 0; c < source_fat.size(); c += 3) {
		const uint32_t double_cluster = uint32_t(source_fat[c] + (source_fat[c + 1] << 8) + (source_fat[c + 2] << 16));
		volume.fat.push_back(uint16_t(double_cluster & 0xfff));
		volume.fat.push_back(uint16_t(double_cluster >> 12));
	}

	// Grab the root directory.
	std::vector<uint8_t> root_directory;
	for(size_t c = 0; c < root_directory_sectors; c++) {
		const auto sector_number = int(volume.reserved_sectors + c + volume.sectors_per_fat*volume.fat_copies);
		const auto address = volume.chs_for_sector(sector_number);

		const Storage::Encodings::MFM::Sector *const sector =
			parser.sector(address.head, address.cylinder, uint8_t(address.sector));
		if(!sector || sector->samples.empty() || sector->samples[0].size() != volume.bytes_per_sector) {
			return std::nullopt;
		}
		std::copy(sector->samples[0].begin(), sector->samples[0].end(), std::back_inserter(root_directory));
	}
	volume.root_directory = directory_from(root_directory);

	return volume;
}